

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O1

void plutovg_matrix_init_rotate(plutovg_matrix_t *matrix,float angle)

{
  float fVar1;
  float fVar2;
  
  fVar1 = cosf(angle);
  fVar2 = sinf(angle);
  matrix->a = fVar1;
  matrix->b = fVar2;
  matrix->c = -fVar2;
  matrix->d = fVar1;
  matrix->e = 0.0;
  matrix->f = 0.0;
  return;
}

Assistant:

void plutovg_matrix_init_rotate(plutovg_matrix_t* matrix, float angle)
{
    float c = cosf(angle);
    float s = sinf(angle);
    plutovg_matrix_init(matrix, c, s, -s, c, 0, 0);
}